

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::define(Options *this,string *aDefinition)

{
  undefined4 uVar1;
  Option_register *aDefinition_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  Option_register *this_00;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  string local_188;
  uint local_164;
  undefined1 local_160 [4];
  uint i;
  string optionName;
  int definitionIndex;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  undefined8 local_128;
  char *local_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined8 local_108;
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  undefined1 local_b8 [8];
  string ovalue;
  string otype;
  string local_68 [8];
  string rest;
  string aliases;
  size_type location;
  Option_register *definitionEntry;
  string *aDefinition_local;
  Options *this_local;
  
  location = 0;
  definitionEntry = (Option_register *)aDefinition;
  aDefinition_local = (string *)this;
  lVar4 = std::__cxx11::string::find((char *)aDefinition,0x167898);
  if (lVar4 == -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: no \"=\" in option definition: ");
    poVar5 = std::operator<<(poVar5,(string *)definitionEntry);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__cxx11::string::substr((ulong)((long)&rest.field_2 + 8),(ulong)definitionEntry);
  std::__cxx11::string::substr((ulong)local_68,(ulong)definitionEntry);
  std::__cxx11::string::string((string *)(ovalue.field_2._M_local_buf + 8),local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b8,"",&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  lVar4 = std::__cxx11::string::find((char *)local_68,0x1672e6);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)local_e0,(ulong)local_68);
    std::__cxx11::string::operator=((string *)(ovalue.field_2._M_local_buf + 8),local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::substr((ulong)local_100,(ulong)local_68);
    std::__cxx11::string::operator=((string *)local_b8,local_100);
    std::__cxx11::string::~string(local_100);
  }
  local_118._M_current = (char *)std::__cxx11::string::begin();
  local_120 = (char *)std::__cxx11::string::end();
  local_110 = std::remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                        (local_118,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_120,isspace);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_108,&local_110);
  local_130._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_128,&local_130);
  std::__cxx11::string::erase((undefined1 *)((long)&ovalue.field_2 + 8),local_108,local_128);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8));
    if ((((*pcVar6 != 's') &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8)),
         *pcVar6 != 'i')) &&
        (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8)),
        *pcVar6 != 'f')) &&
       (((pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8)),
         *pcVar6 != 'd' &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8)),
         *pcVar6 != 'b')) &&
        (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8)),
        *pcVar6 != 'c')))) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error: unknown option type \'");
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8));
      poVar5 = std::operator<<(poVar5,*pcVar6);
      poVar5 = std::operator<<(poVar5,"\' in defintion: ");
      poVar5 = std::operator<<(poVar5,(string *)definitionEntry);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this_00 = (Option_register *)operator_new(0x88);
    aDefinition_00 = definitionEntry;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ovalue.field_2 + 8));
    Option_register::Option_register
              (this_00,&aDefinition_00->m_definition,*pcVar6,(string *)local_b8);
    location = (size_type)this_00;
    sVar7 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::size
                      (&this->m_optionRegister);
    optionName.field_2._12_4_ = (undefined4)sVar7;
    std::__cxx11::string::string((string *)local_160);
    std::__cxx11::string::operator+=((string *)(rest.field_2._M_local_buf + 8),'|');
    local_164 = 0;
    do {
      uVar8 = (ulong)local_164;
      uVar9 = std::__cxx11::string::size();
      if (uVar9 <= uVar8) {
        std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::push_back
                  (&this->m_optionRegister,(value_type *)&location);
        uVar1 = optionName.field_2._12_4_;
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(ovalue.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
        return uVar1;
      }
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&rest.field_2 + 8));
      iVar3 = isspace((int)*pcVar6);
      if (iVar3 == 0) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&rest.field_2 + 8));
        if (*pcVar6 == '|') {
          bVar2 = isDefined(this,(string *)local_160);
          if (bVar2) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Option \"");
            poVar5 = std::operator<<(poVar5,(string *)local_160);
            poVar5 = std::operator<<(poVar5,"\" from definition:");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<((ostream *)&std::cerr,"\t");
            poVar5 = std::operator<<(poVar5,(string *)definitionEntry);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<((ostream *)&std::cerr,"is already defined in: ");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<((ostream *)&std::cerr,"\t");
            getDefinition(&local_188,this,(string *)local_160);
            poVar5 = std::operator<<(poVar5,(string *)&local_188);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_188);
            exit(1);
          }
          lVar4 = std::__cxx11::string::size();
          uVar1 = optionName.field_2._12_4_;
          if (lVar4 != 0) {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&this->m_optionList,(key_type *)local_160);
            *pmVar10 = uVar1;
          }
          std::__cxx11::string::clear();
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&rest.field_2 + 8));
          std::__cxx11::string::operator+=((string *)local_160,*pcVar6);
        }
      }
      local_164 = local_164 + 1;
    } while( true );
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error: option type is invalid: ");
  poVar5 = std::operator<<(poVar5,(string *)(ovalue.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," in option definition: ");
  poVar5 = std::operator<<(poVar5,(string *)definitionEntry);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int Options::define(const std::string& aDefinition) {
	Option_register* definitionEntry = NULL;

	// Error if definition string doesn't contain an equals sign
	auto location = aDefinition.find("=");
	if (location == std::string::npos) {
		std::cerr << "Error: no \"=\" in option definition: " << aDefinition << std::endl;
		exit(1);
	}

	std::string aliases = aDefinition.substr(0, location);
	std::string rest    = aDefinition.substr(location+1);
	std::string otype   = rest;
	std::string ovalue  = "";

	location = rest.find(":");
	if (location != std::string::npos) {
		otype  = rest.substr(0, location);
		ovalue = rest.substr(location+1);
	}

	// Remove any spaces in the option type field
	otype.erase(remove_if(otype.begin(), otype.end(), ::isspace), otype.end());

	// Option types are only a single charater (b, i, d, c or s)
	if (otype.size() != 1) {
		std::cerr << "Error: option type is invalid: " << otype
			  << " in option definition: " << aDefinition << std::endl;
		exit(1);
	}

	// Check to make sure that the type is known
	if (otype[0] != OPTION_TYPE_string  &&
		 otype[0] != OPTION_TYPE_int     &&
		 otype[0] != OPTION_TYPE_float   &&
		 otype[0] != OPTION_TYPE_double  &&
		 otype[0] != OPTION_TYPE_boolean &&
		 otype[0] != OPTION_TYPE_char ) {
		std::cerr << "Error: unknown option type \'" << otype[0]
			  << "\' in defintion: " << aDefinition << std::endl;
		exit(1);
	}

	// Set up space for a option entry in the register
	definitionEntry = new Option_register(aDefinition, otype[0], ovalue);

	int definitionIndex = (int)m_optionRegister.size();

	// Store option aliases
	std::string optionName;
	unsigned int i;
	aliases += '|';
	for (i=0; i<aliases.size(); i++) {
		if (::isspace(aliases[i])) {
			continue;
		} else if (aliases[i] == '|') {
			if (isDefined(optionName)) {
				std::cerr << "Option \"" << optionName << "\" from definition:" << std::endl;
				std::cerr << "\t" << aDefinition << std::endl;
				std::cerr << "is already defined in: " << std::endl;
				std::cerr << "\t" << getDefinition(optionName) << std::endl;
				exit(1);
			}
			if (optionName.size() > 0) {
				m_optionList[optionName] = definitionIndex;
			}
			optionName.clear();
		} else {
			optionName += aliases[i];
		}
	}

	// Store definition in register and return its indexed location.
	// This location will be used to link option aliases to the main
	// command name.
	m_optionRegister.push_back(definitionEntry);
	return definitionIndex;
}